

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::GLES2ThreadTest::Object::modifyGL
          (Object *this,SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync> *sync,
          vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>_>_>
          *deps)

{
  FenceSync *pFVar1;
  int readNdx;
  long lVar2;
  pointer pSVar3;
  long lVar4;
  
  lVar4 = 0;
  for (lVar2 = 0;
      pSVar3 = (this->m_readSyncs).
               super__Vector_base<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      lVar2 < (int)((ulong)((long)(this->m_readSyncs).
                                  super__Vector_base<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar3) >> 4);
      lVar2 = lVar2 + 1) {
    pFVar1 = *(FenceSync **)((long)&pSVar3->m_ptr + lVar4);
    if (pFVar1 != (FenceSync *)0x0) {
      FenceSync::addWaiter(pFVar1);
      pSVar3 = (this->m_readSyncs).
               super__Vector_base<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    std::
    vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>_>_>
    ::push_back(deps,(value_type *)((long)&pSVar3->m_ptr + lVar4));
    lVar4 = lVar4 + 0x10;
  }
  pFVar1 = (this->m_modifySync).m_ptr;
  if (pFVar1 != (FenceSync *)0x0) {
    FenceSync::addWaiter(pFVar1);
  }
  std::
  vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>_>_>
  ::push_back(deps,&this->m_modifySync);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>::operator=(&this->m_modifySync,sync);
  std::
  vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>_>_>
  ::clear(&this->m_readSyncs);
  return;
}

Assistant:

void Object::modifyGL (SharedPtr<FenceSync> sync, std::vector<SharedPtr<FenceSync> >& deps)
{
	// Make call depend on all reads
	for (int readNdx = 0; readNdx < (int)m_readSyncs.size(); readNdx++)
	{
		if (m_readSyncs[readNdx])
			m_readSyncs[readNdx]->addWaiter();

		deps.push_back(m_readSyncs[readNdx]);
	}

	if (m_modifySync)
		m_modifySync->addWaiter();

	deps.push_back(m_modifySync);

	// Update last modifying call
	m_modifySync = sync;

	// Clear read dependencies of last "version" of this object
	m_readSyncs.clear();
}